

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_statics.cpp
# Opt level: O2

ON_ModelComponentTypeIterator *
Internal_ON_ModelComponentIterator_Init
          (ON_ModelComponentTypeIterator *__return_storage_ptr__,int list_selector)

{
  Type *types;
  size_t type_count;
  Type table_types [9];
  Type explicit_types [13];
  
  types = table_types;
  explicit_types[8] = RenderLight;
  explicit_types[9] = HatchPattern;
  explicit_types[10] = InstanceDefinition;
  explicit_types[0xb] = ModelGeometry;
  explicit_types[0xc] = HistoryRecord;
  explicit_types[0] = Image;
  explicit_types[1] = TextureMapping;
  explicit_types[2] = Material;
  explicit_types[3] = LinePattern;
  explicit_types[4] = Layer;
  explicit_types[5] = Group;
  explicit_types[6] = TextStyle;
  explicit_types[7] = DimStyle;
  table_types[0] = TextureMapping;
  table_types[1] = Material;
  table_types[2] = LinePattern;
  table_types[3] = Layer;
  table_types[4] = Group;
  table_types[5] = TextStyle;
  table_types[6] = DimStyle;
  table_types[7] = HatchPattern;
  table_types[8] = InstanceDefinition;
  if (list_selector == 1) {
    type_count = 0xd;
    types = explicit_types;
  }
  else {
    type_count = 9;
  }
  ON_ModelComponentTypeIterator::ON_ModelComponentTypeIterator
            (__return_storage_ptr__,type_count,types);
  return __return_storage_ptr__;
}

Assistant:

static const ON_ModelComponentTypeIterator Internal_ON_ModelComponentIterator_Init(
  int list_selector
  )
{
  //const ON_ModelComponent::Type all_types[] =
  //{
  //  ON_ModelComponent::Type::Unset,
  //  ON_ModelComponent::Type::Image,
  //  ON_ModelComponent::Type::TextureMapping,
  //  ON_ModelComponent::Type::RenderMaterial,
  //  ON_ModelComponent::Type::LinePattern,
  //  ON_ModelComponent::Type::Layer,
  //  ON_ModelComponent::Type::Group,
  //  ON_ModelComponent::Type::TextStyle,
  //  ON_ModelComponent::Type::DimStyle,
  //  ON_ModelComponent::Type::RenderLight,
  //  ON_ModelComponent::Type::HatchPattern,
  //  ON_ModelComponent::Type::InstanceDefinition,
  //  ON_ModelComponent::Type::ModelGeometry,
  //  ON_ModelComponent::Type::HistoryRecord,
  //  ON_ModelComponent::Type::Mixed,
  //};

  const ON_ModelComponent::Type explicit_types[] =
  {
    //ALWAYS EXCLUDE// ON_ModelComponent::Type::Unset,
    ON_ModelComponent::Type::Image,
    ON_ModelComponent::Type::TextureMapping,
    ON_ModelComponent::Type::RenderMaterial,
    ON_ModelComponent::Type::LinePattern,
    ON_ModelComponent::Type::Layer,
    ON_ModelComponent::Type::Group,
    ON_ModelComponent::Type::TextStyle,
    ON_ModelComponent::Type::DimStyle,
    ON_ModelComponent::Type::RenderLight,
    ON_ModelComponent::Type::HatchPattern,
    ON_ModelComponent::Type::InstanceDefinition,
    ON_ModelComponent::Type::ModelGeometry,
    ON_ModelComponent::Type::HistoryRecord,
    //ALWAYS EXCLUDE// ON_ModelComponent::Type::Mixed,
  };

  const ON_ModelComponent::Type table_types[] =
  {
    //ALWAYS EXCLUDE// ON_ModelComponent::Type::Unset,
    //ON_ModelComponent::Type::Image,
    ON_ModelComponent::Type::TextureMapping,
    ON_ModelComponent::Type::RenderMaterial,
    ON_ModelComponent::Type::LinePattern,
    ON_ModelComponent::Type::Layer,
    ON_ModelComponent::Type::Group,
    ON_ModelComponent::Type::TextStyle,
    ON_ModelComponent::Type::DimStyle,
    //ON_ModelComponent::Type::RenderLight,
    ON_ModelComponent::Type::HatchPattern,
    ON_ModelComponent::Type::InstanceDefinition,
    //ON_ModelComponent::Type::ModelGeometry,
    //ON_ModelComponent::Type::HistoryRecord,
    //ALWAYS EXCLUDE// ON_ModelComponent::Type::Mixed,
  };

  switch (list_selector)
  {
    //case 0:
    //  return ON_ModelComponentTypeIterator(sizeof(all_types) / sizeof(all_types[0]), all_types);
  case 1:
    return ON_ModelComponentTypeIterator(sizeof(explicit_types) / sizeof(explicit_types[0]), explicit_types);
  case 2:
    return ON_ModelComponentTypeIterator(sizeof(table_types) / sizeof(table_types[0]), table_types);
  }

  return ON_ModelComponentTypeIterator(0, nullptr);
}